

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TStokesAnalytic::Sigma<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *sigma)

{
  Fad<double> *pFVar1;
  int j_1;
  int i;
  long lVar2;
  int j;
  long lVar3;
  Fad<double> p;
  TPZFMatrix<Fad<double>_> Du;
  TPZFMatrix<Fad<double>_> pIdentity;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_188;
  TPZVec<Fad<double>_> *local_178;
  Fad<double> local_170;
  TPZFMatrix<Fad<double>_> local_150;
  TPZFMatrix<Fad<double>_> local_c0;
  
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&local_150,(sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
             (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (&local_c0,(sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
             (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol);
  local_170.val_ = 0.0;
  local_170.dx_.num_elts = 0;
  local_170.dx_.ptr_to_data = (double *)0x0;
  local_170.defaultVal = 0.0;
  local_178 = x;
  Duxy<Fad<double>>(this,x,&local_150);
  for (lVar2 = 0; lVar2 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
      lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol;
        lVar3 = lVar3 + 1) {
      local_188.fadexpr_.left_ = (Fad<double> *)(this->fvisco + this->fvisco);
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&local_150,lVar2,lVar3);
      Fad<double>::operator*=(pFVar1,(double *)&local_188);
    }
  }
  pressure<Fad<double>>(this,local_178,&local_170);
  for (lVar2 = 0; lVar2 < local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow;
      lVar2 = lVar2 + 1) {
    pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&local_c0,lVar2,lVar2);
    Fad<double>::operator=(pFVar1,&local_170);
  }
  for (lVar2 = 0; lVar2 < (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 < (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
        lVar3 = lVar3 + 1) {
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(&local_150,lVar2,lVar3);
      local_188.fadexpr_.right_ = TPZFMatrix<Fad<double>_>::operator()(&local_c0,lVar2,lVar3);
      local_188.fadexpr_.left_ = pFVar1;
      pFVar1 = TPZFMatrix<Fad<double>_>::operator()(sigma,lVar2,lVar3);
      Fad<double>::operator=(pFVar1,&local_188);
    }
  }
  Fad<double>::~Fad(&local_170);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TStokesAnalytic::Sigma(const TPZVec<TVar> &x, TPZFMatrix<TVar> &sigma) const
{
    TPZFMatrix<TVar> Du(sigma.Rows(),sigma.Cols()), pIdentity(sigma.Rows(),sigma.Cols());
    TVar p=0.;
    Duxy(x,Du);
    for(int i=0; i<Du.Rows(); i++)
    {
        for(int j=0; j<Du.Cols(); j++)
        {
            Du(i,j) *= 2.*fvisco;
        }
    }
    pressure(x, p);
    for (int i=0; i< pIdentity.Rows(); i++) {
        pIdentity(i,i) = p;
    }
    
    for(int i=0; i<sigma.Rows(); i++)
    {
        for(int j=0; j<sigma.Cols(); j++)
        {
            sigma(i,j) = Du(i,j)-pIdentity(i,j);
        }
    }

}